

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O2

void __thiscall
cmComputeTargetDepends::AddTargetDepend
          (cmComputeTargetDepends *this,int depender_index,cmTarget *dependee,bool linking)

{
  set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *psVar1;
  _Base_ptr p_Var2;
  iterator iVar3;
  cmTarget *local_30;
  cmGraphEdge local_28;
  
  local_30 = dependee;
  if ((dependee->IsImportedTarget == false) && (dependee->TargetTypeValue != INTERFACE_LIBRARY)) {
    iVar3 = std::
            _Rb_tree<const_cmTarget_*,_std::pair<const_cmTarget_*const,_int>,_std::_Select1st<std::pair<const_cmTarget_*const,_int>_>,_std::less<const_cmTarget_*>,_std::allocator<std::pair<const_cmTarget_*const,_int>_>_>
            ::find(&(this->TargetIndex)._M_t,&local_30);
    if ((_Rb_tree_header *)iVar3._M_node == &(this->TargetIndex)._M_t._M_impl.super__Rb_tree_header)
    {
      __assert_fail("tii != this->TargetIndex.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmComputeTargetDepends.cxx"
                    ,0x1b9,
                    "void cmComputeTargetDepends::AddTargetDepend(int, const cmTarget *, bool)");
    }
    local_28.Dest = *(int *)&iVar3._M_node[1]._M_parent;
    local_28.Strong = !linking;
    std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::emplace_back<cmGraphEdge>
              (&(this->InitialGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>
                .super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                super__Vector_impl_data._M_start[depender_index].
                super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>,&local_28);
  }
  else {
    psVar1 = cmTarget::GetUtilityItems(dependee);
    for (p_Var2 = (psVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(psVar1->_M_t)._M_impl.super__Rb_tree_header;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      if (*(cmTarget **)(p_Var2 + 2) != (cmTarget *)0x0) {
        AddTargetDepend(this,depender_index,*(cmTarget **)(p_Var2 + 2),false);
      }
    }
  }
  return;
}

Assistant:

void cmComputeTargetDepends::AddTargetDepend(int depender_index,
                                             cmTarget const* dependee,
                                             bool linking)
{
  if(dependee->IsImported() ||
     dependee->GetType() == cmTarget::INTERFACE_LIBRARY)
    {
    // Skip IMPORTED and INTERFACE targets but follow their utility
    // dependencies.
    std::set<cmLinkItem> const& utils = dependee->GetUtilityItems();
    for(std::set<cmLinkItem>::const_iterator i = utils.begin();
        i != utils.end(); ++i)
      {
      if(cmTarget const* transitive_dependee = i->Target)
        {
        this->AddTargetDepend(depender_index, transitive_dependee, false);
        }
      }
    }
  else
    {
    // Lookup the index for this target.  All targets should be known by
    // this point.
    std::map<cmTarget const*, int>::const_iterator tii =
      this->TargetIndex.find(dependee);
    assert(tii != this->TargetIndex.end());
    int dependee_index = tii->second;

    // Add this entry to the dependency graph.
    this->InitialGraph[depender_index].push_back(
      cmGraphEdge(dependee_index, !linking));
    }
}